

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall
cmCTestSVN::RunSVNCommand
          (cmCTestSVN *this,vector<const_char_*,_std::allocator<const_char_*>_> *parameters,
          OutputParser *out,OutputParser *err)

{
  cmCTest *this_00;
  bool bVar1;
  int iVar2;
  const_reference ppcVar3;
  char **ppcVar4;
  value_type local_f8;
  value_type local_f0;
  reference local_e8;
  string *opt;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parsedUserOptions;
  string local_a8;
  undefined1 local_88 [8];
  string userOptions;
  value_type local_50;
  undefined1 local_48 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  OutputParser *err_local;
  OutputParser *out_local;
  vector<const_char_*,_std::allocator<const_char_*>_> *parameters_local;
  cmCTestSVN *this_local;
  
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)err;
  bVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty(parameters);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
    local_50 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,&local_50);
    ::cm::
    append<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::vector<const_char_*,_std::allocator<const_char_*>_>,_0>
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,parameters);
    userOptions.field_2._8_8_ = anon_var_dwarf_234e06;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,
               (value_type *)((long)&userOptions.field_2 + 8));
    this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"SVNOptions",
               (allocator<char> *)
               ((long)&parsedUserOptions.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmCTest::GetCTestConfiguration((string *)local_88,this_00,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&parsedUserOptions.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmSystemTools::ParseArguments
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,(string *)local_88);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
    opt = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&opt);
      if (!bVar1) break;
      local_e8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      local_f0 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,&local_f0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    local_f8 = (value_type)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,&local_f8);
    ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](parameters,0);
    iVar2 = strcmp(*ppcVar3,"update");
    if (iVar2 == 0) {
      ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
      this_local._7_1_ =
           cmCTestVC::RunUpdateCommand
                     ((cmCTestVC *)this,ppcVar4,out,
                      (OutputParser *)
                      args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,Auto);
    }
    else {
      ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
      this_local._7_1_ =
           cmCTestVC::RunChild((cmCTestVC *)this,ppcVar4,out,
                               (OutputParser *)
                               args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(char *)0x0,Auto);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
    std::__cxx11::string::~string((string *)local_88);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestSVN::RunSVNCommand(std::vector<char const*> const& parameters,
                               OutputParser* out, OutputParser* err)
{
  if (parameters.empty()) {
    return false;
  }

  std::vector<char const*> args;
  args.push_back(this->CommandLineTool.c_str());
  cm::append(args, parameters);
  args.push_back("--non-interactive");

  std::string userOptions = this->CTest->GetCTestConfiguration("SVNOptions");

  std::vector<std::string> parsedUserOptions =
    cmSystemTools::ParseArguments(userOptions);
  for (std::string const& opt : parsedUserOptions) {
    args.push_back(opt.c_str());
  }

  args.push_back(nullptr);

  if (strcmp(parameters[0], "update") == 0) {
    return this->RunUpdateCommand(args.data(), out, err);
  }
  return this->RunChild(args.data(), out, err);
}